

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rm_filehandle.cc
# Opt level: O2

RM_FileHandle * __thiscall RM_FileHandle::operator=(RM_FileHandle *this,RM_FileHandle *fileHandle)

{
  int iVar1;
  int iVar2;
  PageNum PVar3;
  
  if (this != fileHandle) {
    this->openedFH = fileHandle->openedFH;
    this->header_modified = fileHandle->header_modified;
    PF_FileHandle::operator=(&this->pfh,&fileHandle->pfh);
    iVar1 = (fileHandle->header).numRecordsPerPage;
    iVar2 = (fileHandle->header).numPages;
    PVar3 = (fileHandle->header).firstFreePage;
    (this->header).recordSize = (fileHandle->header).recordSize;
    (this->header).numRecordsPerPage = iVar1;
    (this->header).numPages = iVar2;
    (this->header).firstFreePage = PVar3;
    iVar1 = (fileHandle->header).bitmapSize;
    (this->header).bitmapOffset = (fileHandle->header).bitmapOffset;
    (this->header).bitmapSize = iVar1;
  }
  return this;
}

Assistant:

RM_FileHandle& RM_FileHandle::operator= (const RM_FileHandle &fileHandle){
  // sets all contents equal to another RM_FileHandle object
  if (this != &fileHandle){
    this->openedFH = fileHandle.openedFH;
    this->header_modified = fileHandle.header_modified;
    this->pfh = fileHandle.pfh;
    memcpy(&this->header, &fileHandle.header, sizeof(struct RM_FileHeader));
  }
  return (*this);
}